

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

attributes_t * __thiscall
tchecker::syncprod::synchronizer_t::attributes
          (attributes_t *__return_storage_ptr__,synchronizer_t *this,state_t *state)

{
  capacity_t cVar1;
  bool bVar2;
  capacity_t cVar3;
  element_type *peVar4;
  element_type *this_00;
  attributes_t *this_01;
  const_iterator_t *pcVar5;
  string *psVar6;
  string *value;
  attr_parsing_position_t *parsing_position;
  vloc_t *this_02;
  range_t<tchecker::system::attributes_t::const_iterator_t,_tchecker::system::attributes_t::const_iterator_t>
  rVar7;
  attr_parsing_position_t local_168;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  attr_parsing_position_t local_d8;
  attr_t *local_98;
  attr_t *attr;
  const_iterator_t __end3;
  const_iterator_t __begin3;
  range_t<tchecker::system::attributes_t::const_iterator_t,_tchecker::system::attributes_t::const_iterator_t>
  local_70;
  range_t<tchecker::system::attributes_t::const_iterator_t,_tchecker::system::attributes_t::const_iterator_t>
  *local_60;
  range_t<tchecker::system::attributes_t::const_iterator_t,_tchecker::system::attributes_t::const_iterator_t>
  *__range3;
  pointer pvStack_50;
  loc_id_t id;
  const_iterator_t __end2;
  const_iterator_t __begin2;
  pointer local_30;
  vloc_t *__range2;
  state_t *psStack_20;
  process_id_t count_initial;
  state_t *state_local;
  synchronizer_t *this_local;
  attributes_t *attributes;
  
  __range2._4_4_ = 0;
  __range2._3_1_ = 0;
  psStack_20 = state;
  state_local = (state_t *)this;
  this_local = (synchronizer_t *)__return_storage_ptr__;
  tchecker::system::attributes_t::attributes_t(__return_storage_ptr__);
  local_30 = (pointer)state_t::vloc(psStack_20);
  __end2 = make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t>::begin
                     ((make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *)local_30);
  pvStack_50 = (pointer)make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t>::end
                                  ((make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *)
                                   local_30);
  for (; cVar1 = __range2._4_4_, (pointer)__end2 != pvStack_50; __end2 = __end2 + 1) {
    __range3._4_4_ = *__end2;
    peVar4 = std::
             __shared_ptr_access<const_tchecker::syncprod::system_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_tchecker::syncprod::system_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    tchecker::system::locs_t::location((locs_t *)&__begin3,(int)peVar4 + 0x230);
    this_00 = std::
              __shared_ptr_access<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&__begin3);
    this_01 = tchecker::system::loc_t::attributes(this_00);
    rVar7 = tchecker::system::attributes_t::range(this_01);
    local_70 = rVar7;
    std::shared_ptr<const_tchecker::system::loc_t>::~shared_ptr
              ((shared_ptr<const_tchecker::system::loc_t> *)&__begin3);
    local_60 = &local_70;
    pcVar5 = range_t<tchecker::system::attributes_t::const_iterator_t,_tchecker::system::attributes_t::const_iterator_t>
             ::begin(local_60);
    __end3.super_const_iterator.
    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
    ._M_cur = (const_iterator)
              (pcVar5->super_const_iterator).
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
              ._M_cur;
    pcVar5 = range_t<tchecker::system::attributes_t::const_iterator_t,_tchecker::system::attributes_t::const_iterator_t>
             ::end(local_60);
    attr = (attr_t *)
           (pcVar5->super_const_iterator).
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
           ._M_cur;
    while( true ) {
      bVar2 = std::__detail::operator!=
                        ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
                          *)&__end3,
                         (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
                          *)&attr);
      if (!bVar2) break;
      local_98 = &tchecker::system::attributes_t::const_iterator_t::operator*(&__end3)->super_attr_t
      ;
      psVar6 = parsing::attr_t::key_abi_cxx11_(local_98);
      bVar2 = std::operator==(psVar6,"initial");
      if (bVar2) {
        __range2._4_4_ = __range2._4_4_ + 1;
      }
      else {
        psVar6 = parsing::attr_t::key_abi_cxx11_(local_98);
        value = parsing::attr_t::value_abi_cxx11_(local_98);
        parsing_position = parsing::attr_t::parsing_position(local_98);
        tchecker::system::attr_parsing_position_t::attr_parsing_position_t
                  (&local_d8,parsing_position);
        tchecker::system::attributes_t::add_attribute(__return_storage_ptr__,psVar6,value,&local_d8)
        ;
        tchecker::system::attr_parsing_position_t::~attr_parsing_position_t(&local_d8);
      }
      std::__detail::
      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_false,_true>
      ::operator++(&__end3.super_const_iterator);
    }
  }
  this_02 = state_t::vloc(psStack_20);
  cVar3 = vloc_t::size(this_02);
  if (cVar1 == cVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"initial",&local_f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"",&local_121);
    local_168.super_attr_parsing_position_t._value_position.field_2._M_allocated_capacity = 0;
    local_168.super_attr_parsing_position_t._value_position.field_2._8_8_ = 0;
    local_168.super_attr_parsing_position_t._value_position._M_dataplus = (_Alloc_hider)0x0;
    local_168.super_attr_parsing_position_t._value_position._1_7_ = 0;
    local_168.super_attr_parsing_position_t._value_position._M_string_length = 0;
    local_168.super_attr_parsing_position_t._key_position.field_2._M_allocated_capacity = 0;
    local_168.super_attr_parsing_position_t._key_position.field_2._8_8_ = 0;
    local_168.super_attr_parsing_position_t._key_position._M_dataplus = (_Alloc_hider)0x0;
    local_168.super_attr_parsing_position_t._key_position._1_7_ = 0;
    local_168.super_attr_parsing_position_t._key_position._M_string_length = 0;
    tchecker::system::attr_parsing_position_t::attr_parsing_position_t(&local_168);
    tchecker::system::attributes_t::add_attribute
              (__return_storage_ptr__,&local_f8,&local_120,&local_168);
    tchecker::system::attr_parsing_position_t::~attr_parsing_position_t(&local_168);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator(&local_121);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator(&local_f9);
  }
  return __return_storage_ptr__;
}

Assistant:

tchecker::system::attributes_t attributes(tchecker::syncprod::state_t const & state)
  {
    tchecker::process_id_t count_initial = 0;
    tchecker::system::attributes_t attributes;
    for (tchecker::loc_id_t id : state.vloc())
      for (auto && attr : _system->location(id)->attributes().range()) {
        if (attr.key() == "initial")
          ++count_initial;
        else
          attributes.add_attribute(attr.key(), attr.value(), attr.parsing_position());
      }
    if (count_initial == state.vloc().size()) // all processes initial
      attributes.add_attribute("initial", "", tchecker::system::attr_parsing_position_t{});
    return attributes;
  }